

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O0

bool google::GetSectionHeaderByType
               (int fd,Elf64_Half sh_num,off_t sh_offset,Elf64_Word type,Elf64_Shdr *out)

{
  ulong uVar1;
  size_t local_470;
  int local_464;
  int j;
  ssize_t num_headers_in_buf;
  ssize_t len;
  ssize_t num_bytes_to_read;
  ssize_t num_bytes_left;
  undefined1 local_438 [4];
  int i;
  Elf64_Shdr buf [16];
  Elf64_Shdr *out_local;
  Elf64_Word type_local;
  off_t sh_offset_local;
  Elf64_Half sh_num_local;
  int fd_local;
  
  num_bytes_left._4_4_ = 0;
  while( true ) {
    if ((int)(uint)sh_num <= num_bytes_left._4_4_) {
      return false;
    }
    local_470 = (long)(int)((uint)sh_num - num_bytes_left._4_4_) << 6;
    if (0x3ff < local_470) {
      local_470 = 0x400;
    }
    uVar1 = ReadFromOffset(fd,local_438,local_470,sh_offset + (long)num_bytes_left._4_4_ * 0x40);
    if (uVar1 == 0xffffffffffffffff) break;
    if ((uVar1 & 0x3f) != 0) {
      AssertFail();
    }
    uVar1 = uVar1 >> 6;
    if (0x10 < uVar1) {
      AssertFail();
    }
    for (local_464 = 0; (long)local_464 < (long)uVar1; local_464 = local_464 + 1) {
      if (*(Elf64_Word *)((long)&buf[(long)local_464 + -1].sh_entsize + 4) == type) {
        memcpy(out,local_438 + (long)local_464 * 0x40,0x40);
        return true;
      }
    }
    num_bytes_left._4_4_ = num_bytes_left._4_4_ + (int)uVar1;
  }
  return false;
}

Assistant:

static ATTRIBUTE_NOINLINE bool
GetSectionHeaderByType(const int fd, ElfW(Half) sh_num, const off_t sh_offset,
                       ElfW(Word) type, ElfW(Shdr) *out) {
  // Read at most 16 section headers at a time to save read calls.
  ElfW(Shdr) buf[16];
  for (int i = 0; i < sh_num;) {
    const ssize_t num_bytes_left = (sh_num - i) * sizeof(buf[0]);
    const ssize_t num_bytes_to_read =
        (sizeof(buf) > num_bytes_left) ? num_bytes_left : sizeof(buf);
    const ssize_t len = ReadFromOffset(fd, buf, num_bytes_to_read,
                                       sh_offset + i * sizeof(buf[0]));
    if (len == -1) {
      return false;
    }
    SAFE_ASSERT(len % sizeof(buf[0]) == 0);
    const ssize_t num_headers_in_buf = len / sizeof(buf[0]);
    SAFE_ASSERT(num_headers_in_buf <= sizeof(buf) / sizeof(buf[0]));
    for (int j = 0; j < num_headers_in_buf; ++j) {
      if (buf[j].sh_type == type) {
        *out = buf[j];
        return true;
      }
    }
    i += num_headers_in_buf;
  }
  return false;
}